

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O0

void __thiscall
cmMakefileTargetGenerator::cmMakefileTargetGenerator
          (cmMakefileTargetGenerator *this,cmGeneratorTarget *target)

{
  bool bVar1;
  cmMakefile *pcVar2;
  cmLocalUnixMakefileGenerator3 *pcVar3;
  char *pcVar4;
  cmGlobalUnixMakefileGenerator3 *pcVar5;
  cmState *this_00;
  MacOSXContentGeneratorType *this_01;
  allocator local_59;
  string local_58;
  char *local_38;
  char *ruleStatus;
  cmake *cm;
  cmGeneratorTarget *local_18;
  cmGeneratorTarget *target_local;
  cmMakefileTargetGenerator *this_local;
  
  this->_vptr_cmMakefileTargetGenerator = (_func_int **)&PTR__cmMakefileTargetGenerator_00a42680;
  local_18 = target;
  target_local = (cmGeneratorTarget *)this;
  std::__cxx11::string::string((string *)&this->ConfigName);
  std::__cxx11::string::string((string *)&this->BuildFileName);
  std::__cxx11::string::string((string *)&this->BuildFileNameFull);
  std::__cxx11::string::string((string *)&this->ProgressFileNameFull);
  std::__cxx11::string::string((string *)&this->TargetBuildDirectory);
  std::__cxx11::string::string((string *)&this->TargetBuildDirectoryFull);
  std::__cxx11::string::string((string *)&this->FlagFileNameFull);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmMakefileTargetGenerator::StringList,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmMakefileTargetGenerator::StringList>_>_>
  ::map(&this->FlagFileDepends);
  std::__cxx11::string::string((string *)&this->InfoFileNameFull);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->CleanFiles);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->Objects);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->ExternalObjects);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&this->ObjectFiles);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&this->ExtraFiles);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&this->MultipleOutputPairs);
  std::__cxx11::string::string((string *)&this->TargetNameOut);
  std::__cxx11::string::string((string *)&this->TargetNameSO);
  std::__cxx11::string::string((string *)&this->TargetNameReal);
  std::__cxx11::string::string((string *)&this->TargetNameImport);
  std::__cxx11::string::string((string *)&this->TargetNamePDB);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&this->MacContentFolders);
  this->OSXBundleGenerator = (cmOSXBundleGenerator *)0x0;
  this->MacOSXContentGenerator = (MacOSXContentGeneratorType *)0x0;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&this->FlagsByLanguage);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&this->DefinesByLanguage);
  std::__cxx11::string::string((string *)&this->FortranModuleDirectory);
  this->BuildFileStream = (cmGeneratedFileStream *)0x0;
  this->InfoFileStream = (cmGeneratedFileStream *)0x0;
  this->FlagFileStream = (cmGeneratedFileStream *)0x0;
  this->CustomCommandDriver = OnBuild;
  this->FortranModuleDirectoryComputed = false;
  this->Target = local_18->Target;
  pcVar2 = cmTarget::GetMakefile(this->Target);
  this->Makefile = pcVar2;
  pcVar3 = (cmLocalUnixMakefileGenerator3 *)cmGeneratorTarget::GetLocalGenerator(local_18);
  this->LocalGenerator = pcVar3;
  pcVar4 = (char *)std::__cxx11::string::c_str();
  std::__cxx11::string::operator=((string *)&this->ConfigName,pcVar4);
  pcVar5 = (cmGlobalUnixMakefileGenerator3 *)
           cmLocalGenerator::GetGlobalGenerator(&this->LocalGenerator->super_cmLocalGenerator);
  this->GlobalGenerator = pcVar5;
  this->GeneratorTarget = local_18;
  ruleStatus = (char *)cmGlobalGenerator::GetCMakeInstance
                                 (&this->GlobalGenerator->super_cmGlobalGenerator);
  this->NoRuleMessages = false;
  this_00 = cmake::GetState((cmake *)ruleStatus);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_58,"RULE_MESSAGES",&local_59);
  pcVar4 = cmState::GetGlobalProperty(this_00,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  local_38 = pcVar4;
  if (pcVar4 != (char *)0x0) {
    bVar1 = cmSystemTools::IsOff(pcVar4);
    this->NoRuleMessages = bVar1;
  }
  this_01 = (MacOSXContentGeneratorType *)operator_new(0x10);
  MacOSXContentGeneratorType::MacOSXContentGeneratorType(this_01,this);
  this->MacOSXContentGenerator = this_01;
  return;
}

Assistant:

cmMakefileTargetGenerator::cmMakefileTargetGenerator(cmGeneratorTarget* target)
  : OSXBundleGenerator(0)
  , MacOSXContentGenerator(0)
{
  this->BuildFileStream = 0;
  this->InfoFileStream = 0;
  this->FlagFileStream = 0;
  this->CustomCommandDriver = OnBuild;
  this->FortranModuleDirectoryComputed = false;
  this->Target = target->Target;
  this->Makefile = this->Target->GetMakefile();
  this->LocalGenerator =
    static_cast<cmLocalUnixMakefileGenerator3*>(target->GetLocalGenerator());
  this->ConfigName = this->LocalGenerator->ConfigurationName.c_str();
  this->GlobalGenerator =
    static_cast<cmGlobalUnixMakefileGenerator3*>(
      this->LocalGenerator->GetGlobalGenerator());
  this->GeneratorTarget = target;
  cmake* cm = this->GlobalGenerator->GetCMakeInstance();
  this->NoRuleMessages = false;
  if(const char* ruleStatus = cm->GetState()
                                ->GetGlobalProperty("RULE_MESSAGES"))
    {
    this->NoRuleMessages = cmSystemTools::IsOff(ruleStatus);
    }
  MacOSXContentGenerator = new MacOSXContentGeneratorType(this);
}